

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdLocal.c
# Opt level: O3

DdNode * Dsd_TreeGetPrimeFunction(DdManager *dd,Dsd_Node_t *pNode)

{
  int iVar1;
  Dsd_Node_t *pDVar2;
  int *permut;
  int *pVar2Form;
  int *pForm2Var;
  DdNode **pbCube0;
  DdNode **pbCube1;
  DdNode *pDVar3;
  DdNode *pDVar4;
  st__table *pCache;
  DdNode *pDVar5;
  size_t sVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  
  iVar9 = dd->size;
  sVar6 = (long)iVar9 * 4;
  permut = (int *)malloc(sVar6);
  pVar2Form = (int *)malloc(sVar6);
  pForm2Var = (int *)malloc(sVar6);
  sVar6 = (long)iVar9 << 3;
  pbCube0 = (DdNode **)malloc(sVar6);
  pbCube1 = (DdNode **)malloc(sVar6);
  if (0 < pNode->nDecs) {
    lVar7 = 0;
    iVar9 = 0;
    do {
      piVar8 = dd->invperm;
      pForm2Var[lVar7] = piVar8[lVar7];
      pDVar2 = pNode->pDecs[lVar7];
      pDVar3 = dd->one;
      pDVar5 = pDVar2->S;
      if (pDVar5 != pDVar3) {
        piVar8 = piVar8 + iVar9;
        do {
          iVar1 = *piVar8;
          permut[pDVar5->index] = iVar1;
          pVar2Form[iVar1] = (int)lVar7;
          pDVar5 = (pDVar5->type).kids.T;
          piVar8 = piVar8 + 1;
          iVar9 = iVar9 + 1;
        } while (pDVar5 != pDVar3);
      }
      pDVar3 = Extra_bddGetOneCube(dd,(DdNode *)((ulong)pDVar2->G ^ 1));
      pbCube0[lVar7] = pDVar3;
      Cudd_Ref(pDVar3);
      pDVar3 = Extra_bddGetOneCube(dd,pNode->pDecs[lVar7]->G);
      pbCube1[lVar7] = pDVar3;
      Cudd_Ref(pDVar3);
      lVar7 = lVar7 + 1;
    } while (lVar7 < pNode->nDecs);
  }
  pDVar3 = Cudd_bddPermute(dd,pNode->G,permut);
  Cudd_Ref(pDVar3);
  if (0 < pNode->nDecs) {
    lVar7 = 0;
    do {
      pDVar5 = pbCube0[lVar7];
      pDVar4 = Cudd_bddPermute(dd,pDVar5,permut);
      pbCube0[lVar7] = pDVar4;
      Cudd_Ref(pDVar4);
      Cudd_RecursiveDeref(dd,pDVar5);
      pDVar5 = pbCube1[lVar7];
      pDVar4 = Cudd_bddPermute(dd,pDVar5,permut);
      pbCube1[lVar7] = pDVar4;
      Cudd_Ref(pDVar4);
      Cudd_RecursiveDeref(dd,pDVar5);
      lVar7 = lVar7 + 1;
    } while (lVar7 < pNode->nDecs);
  }
  pCache = st__init_table(st__ptrcmp,st__ptrhash);
  pDVar5 = Extra_dsdRemap(dd,pDVar3,pCache,pVar2Form,pForm2Var,pbCube0,pbCube1);
  Cudd_Ref(pDVar5);
  st__free_table(pCache);
  Cudd_RecursiveDeref(dd,pDVar3);
  if (0 < pNode->nDecs) {
    lVar7 = 0;
    do {
      Cudd_RecursiveDeref(dd,pbCube0[lVar7]);
      Cudd_RecursiveDeref(dd,pbCube1[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < pNode->nDecs);
  }
  if (permut != (int *)0x0) {
    free(permut);
  }
  if (pVar2Form != (int *)0x0) {
    free(pVar2Form);
  }
  if (pForm2Var != (int *)0x0) {
    free(pForm2Var);
  }
  if (pbCube0 != (DdNode **)0x0) {
    free(pbCube0);
  }
  if (pbCube1 != (DdNode **)0x0) {
    free(pbCube1);
  }
  Cudd_Deref(pDVar5);
  return pDVar5;
}

Assistant:

DdNode * Dsd_TreeGetPrimeFunction( DdManager * dd, Dsd_Node_t * pNode ) 
{
    int * pForm2Var;   // the mapping of each formal input into its first var
    int * pVar2Form;   // the mapping of each var into its formal inputs
    int i, iVar, iLev, * pPermute;
    DdNode ** pbCube0, ** pbCube1;
    DdNode * bFunc, * bRes, * bTemp;
    st__table * pCache;
    
    pPermute  = ABC_ALLOC( int, dd->size );
    pVar2Form = ABC_ALLOC( int, dd->size );
    pForm2Var = ABC_ALLOC( int, dd->size );

    pbCube0 = ABC_ALLOC( DdNode *, dd->size );
    pbCube1 = ABC_ALLOC( DdNode *, dd->size );

    // remap the global function in such a way that
    // the support variables of each formal input are adjacent
    iLev = 0;
    for ( i = 0; i < pNode->nDecs; i++ )
    {
        pForm2Var[i] = dd->invperm[i];
        for ( bTemp = pNode->pDecs[i]->S; bTemp != b1; bTemp = cuddT(bTemp) )
        {
            iVar = dd->invperm[iLev];
            pPermute[bTemp->index] = iVar;
            pVar2Form[iVar] = i;
            iLev++;
        }

        // collect the cubes representing each assignment
        pbCube0[i] = Extra_bddGetOneCube( dd, Cudd_Not(pNode->pDecs[i]->G) );
        Cudd_Ref( pbCube0[i] );
        pbCube1[i] = Extra_bddGetOneCube( dd, pNode->pDecs[i]->G );
        Cudd_Ref( pbCube1[i] );
    }

    // remap the function
    bFunc = Cudd_bddPermute( dd, pNode->G, pPermute ); Cudd_Ref( bFunc );
    // remap the cube
    for ( i = 0; i < pNode->nDecs; i++ )
    {
        pbCube0[i] = Cudd_bddPermute( dd, bTemp = pbCube0[i], pPermute ); Cudd_Ref( pbCube0[i] );
        Cudd_RecursiveDeref( dd, bTemp );
        pbCube1[i] = Cudd_bddPermute( dd, bTemp = pbCube1[i], pPermute ); Cudd_Ref( pbCube1[i] );
        Cudd_RecursiveDeref( dd, bTemp );
    }

    // remap the function
    pCache = st__init_table( st__ptrcmp, st__ptrhash);;
    bRes = Extra_dsdRemap( dd, bFunc, pCache, pVar2Form, pForm2Var, pbCube0, pbCube1 );  Cudd_Ref( bRes );
    st__free_table( pCache );

    Cudd_RecursiveDeref( dd, bFunc );
    for ( i = 0; i < pNode->nDecs; i++ )
    {
        Cudd_RecursiveDeref( dd, pbCube0[i] );
        Cudd_RecursiveDeref( dd, pbCube1[i] );
    }
/*
////////////
    // permute the function once again
    // in such a way that i-th var stood for i-th formal input
    for ( i = 0; i < dd->size; i++ )
        pPermute[i] = -1;
    for ( i = 0; i < pNode->nDecs; i++ )
        pPermute[dd->invperm[i]] = i;
    bRes = Cudd_bddPermute( dd, bTemp = bRes, pPermute ); Cudd_Ref( bRes );
    Cudd_RecursiveDeref( dd, bTemp );
////////////
*/
    ABC_FREE(pPermute);
    ABC_FREE(pVar2Form);
    ABC_FREE(pForm2Var);
    ABC_FREE(pbCube0);
    ABC_FREE(pbCube1);

    Cudd_Deref( bRes );
    return bRes;
}